

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  tst_qpromise_operators tc;
  QCoreApplication app;
  int local_2c;
  undefined **local_28 [2];
  QCoreApplication local_18 [16];
  
  local_2c = argc;
  QCoreApplication::QCoreApplication(local_18,&local_2c,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QObject::QObject((QObject *)local_28,(QObject *)0x0);
  local_28[0] = &PTR_metaObject_0011c598;
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O1/tests/auto/qtpromise/qpromise"
            );
  iVar1 = QTest::qExec((QObject *)local_28,local_2c,argv);
  QObject::~QObject((QObject *)local_28);
  QCoreApplication::~QCoreApplication(local_18);
  return iVar1;
}

Assistant:

void tst_qpromise_operators::move()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1), 42);

    p0 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1), 43);
}